

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O2

void __thiscall clickhouse::Client::Impl::~Impl(Impl *this)

{
  ServerInfo::~ServerInfo(&this->server_info_);
  BufferedOutput::~BufferedOutput(&this->buffered_output_);
  SocketOutput::~SocketOutput(&this->socket_output_);
  BufferedInput::~BufferedInput(&this->buffered_input_);
  SocketInput::~SocketInput(&this->socket_input_);
  SocketHolder::~SocketHolder(&this->socket_);
  ClientOptions::~ClientOptions(&this->options_);
  return;
}

Assistant:

Client::Impl::~Impl()
{ }